

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_type_createAnonymousPrimitiveValueTypeAndValueMetatype
          (sysbvm_context_t *context,sysbvm_tuple_t supertype)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sVar3;
  
  sVar3 = (context->roots).primitiveValueType;
  sVar2 = sysbvm_tuple_getType(context,supertype);
  _Var1 = sysbvm_type_isDirectSubtypeOf(sVar2,(context->roots).primitiveValueType);
  if (_Var1) {
    sVar3 = sVar2;
  }
  sVar3 = sysbvm_type_createAnonymousValueMetatype(context,sVar3,0x1d);
  sVar2 = sysbvm_type_createAnonymousPrimitiveValueType(context,supertype,sVar3);
  if ((sVar3 & 0xf) == 0 && sVar3 != 0) {
    *(undefined8 *)(sVar3 + 0x70) = 0x11b;
  }
  *(sysbvm_tuple_t *)(sVar3 + 0xf8) = sVar2;
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createAnonymousPrimitiveValueTypeAndValueMetatype(sysbvm_context_t *context, sysbvm_tuple_t supertype)
{
    sysbvm_tuple_t metatypeSupertype = context->roots.primitiveValueType;
    sysbvm_tuple_t actualSuperType = supertype;
    sysbvm_tuple_t supertypeMetatype = sysbvm_tuple_getType(context, supertype);
    if(sysbvm_type_isDirectSubtypeOf(supertypeMetatype, context->roots.primitiveValueType))
        metatypeSupertype = supertypeMetatype;

    sysbvm_tuple_t metatype = sysbvm_type_createAnonymousValueMetatype(context, metatypeSupertype, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_primitiveValueType_t));
    sysbvm_tuple_t primitiveValueType = sysbvm_type_createAnonymousPrimitiveValueType(context, actualSuperType, metatype);

    sysbvm_type_setFlags(context, metatype, SYSBVM_TYPE_FLAGS_PRIMITIVE_VALUE_TYPE_METATYPE_FLAGS);

    // Link together the type with its metatype.
    sysbvm_metatype_t *metatypeObject = (sysbvm_metatype_t*)metatype;
    metatypeObject->thisType = primitiveValueType;
    return primitiveValueType;
}